

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  Message **ppMVar6;
  Reflection *in_RCX;
  FieldDescriptor *in_RDX;
  FieldDescriptor *in_RDI;
  Message *result;
  char *in_stack_00000048;
  char *in_stack_00000050;
  undefined4 in_stack_00000058;
  CppType in_stack_0000005c;
  Descriptor *in_stack_00000060;
  FieldDescriptor *in_stack_00000068;
  Descriptor *in_stack_00000070;
  Descriptor *in_stack_00000078;
  int in_stack_00000084;
  ExtensionSet *in_stack_00000088;
  FieldDescriptor *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Message *in_stack_ffffffffffffffd0;
  MessageLite *local_8;
  
  pDVar5 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar5 != *(Descriptor **)in_RDI) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6d6d1f);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000070,in_stack_00000068,(char *)in_stack_00000060,in_stack_0000005c);
  }
  if (in_RCX == (Reflection *)0x0) {
    in_RCX = *(Reflection **)(in_RDI + 0x40);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    GetExtensionSet((Reflection *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (Message *)in_stack_ffffffffffffffb8);
    iVar4 = FieldDescriptor::number(in_RDX);
    FieldDescriptor::message_type((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
    local_8 = internal::ExtensionSet::GetMessage
                        (in_stack_00000088,in_stack_00000084,in_stack_00000078,
                         (MessageFactory *)in_stack_00000070);
  }
  else {
    ppMVar6 = GetRaw<google::protobuf::Message_const*>(in_RCX,in_stack_ffffffffffffffd0,in_RDI);
    local_8 = &(*ppMVar6)->super_MessageLite;
    if (local_8 == (MessageLite *)0x0) {
      ppMVar6 = DefaultRaw<google::protobuf::Message_const*>
                          ((Reflection *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
      local_8 = &(*ppMVar6)->super_MessageLite;
    }
  }
  return (Message *)local_8;
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = DefaultRaw<const Message*>(field);
    }
    return *result;
  }
}